

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneField
          (MessageGenerator *this,Printer *printer,FieldDescriptor *field,bool to_array)

{
  FieldDescriptor *this_00;
  bool bVar1;
  FieldGenerator *pFVar2;
  FieldDescriptor *field_00;
  string local_48;
  byte local_21;
  FieldDescriptor *pFStack_20;
  bool to_array_local;
  FieldDescriptor *field_local;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_21 = to_array;
  pFStack_20 = field;
  field_local = (FieldDescriptor *)printer;
  printer_local = (Printer *)this;
  anon_unknown_0::PrintFieldComment(printer,field);
  bVar1 = FieldDescriptor::is_repeated(pFStack_20);
  this_00 = field_local;
  if (!bVar1) {
    FieldName_abi_cxx11_(&local_48,(cpp *)pFStack_20,field_00);
    io::Printer::Print((Printer *)this_00,"if (has_$name$()) {\n","name",&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    io::Printer::Indent((Printer *)field_local);
  }
  if ((local_21 & 1) == 0) {
    pFVar2 = FieldGeneratorMap::get(&this->field_generators_,pFStack_20);
    (*pFVar2->_vptr_FieldGenerator[0xf])(pFVar2,field_local);
  }
  else {
    pFVar2 = FieldGeneratorMap::get(&this->field_generators_,pFStack_20);
    (*pFVar2->_vptr_FieldGenerator[0x10])(pFVar2,field_local);
  }
  bVar1 = FieldDescriptor::is_repeated(pFStack_20);
  if (!bVar1) {
    io::Printer::Outdent((Printer *)field_local);
    io::Printer::Print((Printer *)field_local,"}\n");
  }
  io::Printer::Print((Printer *)field_local,"\n");
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneField(
    io::Printer* printer, const FieldDescriptor* field, bool to_array) {
  PrintFieldComment(printer, field);

  if (!field->is_repeated()) {
    printer->Print(
      "if (has_$name$()) {\n",
      "name", FieldName(field));
    printer->Indent();
  }

  if (to_array) {
    field_generators_.get(field).GenerateSerializeWithCachedSizesToArray(
        printer);
  } else {
    field_generators_.get(field).GenerateSerializeWithCachedSizes(printer);
  }

  if (!field->is_repeated()) {
    printer->Outdent();
    printer->Print("}\n");
  }
  printer->Print("\n");
}